

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
UTF32Test_encode_codepoint_Test::UTF32Test_encode_codepoint_Test
          (UTF32Test_encode_codepoint_Test *this)

{
  UTF32Test_encode_codepoint_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__UTF32Test_encode_codepoint_Test_00812cc0;
  return;
}

Assistant:

TEST(UTF32Test, encode_codepoint) {
	EXPECT_EQ(encode_codepoint_u32(U'\0'), U"\0"sv);
	EXPECT_EQ(encode_codepoint_u32(U'A'), U"A"sv);
	EXPECT_EQ(encode_codepoint_u32(U'z'), U"z"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\u007F'), U"\u007F"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\u0080'), U"\u0080"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\u07FF'), U"\u07FF"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\u0800'), U"\u0800"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\uFFFF'), U"\uFFFF"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\U00010000'), U"\U00010000"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\U0010FFFF'), U"\U0010FFFF"sv);
	EXPECT_EQ(encode_codepoint_u32(U'\U0001F604'), U"\U0001F604"sv);
}